

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialize_node<std::ostream>
               (ImputeNode *node,basic_ostream<char,_std::char_traits<char>_> *out)

{
  pointer pdVar1;
  pointer pvVar2;
  const_iterator __begin2;
  pointer pvVar3;
  const_iterator __end2;
  size_t veclen;
  size_t data_sizets [5];
  size_t local_60;
  size_t local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (!interrupt_switch) {
    local_58 = node->parent;
    local_50 = (long)(node->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    local_48 = (long)(node->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    local_40 = ((long)(node->cat_sum).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(node->cat_sum).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_38 = (long)(node->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(node->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    write_bytes<unsigned_long>(&local_58,5,out);
    pdVar1 = (node->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    write_bytes<double>(pdVar1,(long)(node->num_sum).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3,out);
    pdVar1 = (node->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    write_bytes<double>(pdVar1,(long)(node->num_weight).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3,out);
    pvVar3 = (node->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (node->cat_sum).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2 != pvVar3) {
      do {
        local_60 = (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        write_bytes<unsigned_long>(&local_60,1,out);
        write_bytes<double>((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start,local_60,out);
        pvVar3 = pvVar3 + 1;
      } while (pvVar3 != pvVar2);
    }
    pdVar1 = (node->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    write_bytes<double>(pdVar1,(long)(node->cat_weight).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3,out);
  }
  return;
}

Assistant:

void serialize_node(const ImputeNode &node, otype &out)
{
    if (interrupt_switch) return;

    size_t data_sizets[] = {
        node.parent,
        node.num_sum.size(),
        node.num_weight.size(),
        node.cat_sum.size(),
        node.cat_weight.size(),
    };
    write_bytes<size_t>((void*)data_sizets, (size_t)5, out);

    write_bytes<double>((void*)node.num_sum.data(), node.num_sum.size(), out);

    write_bytes<double>((void*)node.num_weight.data(), node.num_weight.size(), out);

    if (node.cat_sum.size()) {
        size_t veclen;
        for (const auto &v : node.cat_sum) {
            veclen = v.size();
            write_bytes<size_t>((void*)&veclen, (size_t)1, out);
            write_bytes<double>((void*)v.data(), veclen, out);
        }
    }

    write_bytes<double>((void*)node.cat_weight.data(), node.cat_weight.size(), out);
}